

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::PolarizableAtomTypesSectionParser::parseLine
          (PolarizableAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  RealType polarizability;
  PolarizableAdapter fca;
  string atomTypeName;
  StringTokenizer tokenizer;
  PolarizableAdapter local_98;
  string local_90;
  StringTokenizer local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90," ;\t\n\r",(allocator<char> *)&local_98);
  StringTokenizer::StringTokenizer(&local_70,line,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  iVar1 = StringTokenizer::countTokens(&local_70);
  if (iVar1 < 2) {
    snprintf(painCave.errMsg,2000,
             "PolarizableAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_90,&local_70);
    pAVar2 = ForceField::getAtomType(ff,&local_90);
    if (pAVar2 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "PolarizableAtomTypesSectionParser Error: Can not find matching AtomType at line %d\n"
               ,(ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_98.at_ = pAVar2;
      polarizability = StringTokenizer::nextTokenAsDouble(&local_70);
      PolarizableAdapter::makePolarizable(&local_98,polarizability);
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  StringTokenizer::~StringTokenizer(&local_70);
  return;
}

Assistant:

void PolarizableAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const std::string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        PolarizableAdapter fca  = PolarizableAdapter(atomType);
        RealType polarizability = tokenizer.nextTokenAsDouble();
        fca.makePolarizable(polarizability);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "PolarizableAtomTypesSectionParser Error: "
                 "Can not find matching AtomType at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
    }
  }